

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

void __thiscall crnlib::ranctx::seed(ranctx *this,uint32 seed)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  
  this->a = 0xf1ea5eed;
  this->d = seed;
  this->c = seed;
  this->b = seed;
  iVar2 = 0x14;
  uVar5 = seed;
  uVar6 = seed;
  uVar3 = 0xf1ea5eed;
  do {
    uVar1 = uVar5 + seed;
    uVar4 = (seed << 0x11 | seed >> 0xf) ^ uVar6;
    iVar7 = uVar3 - (uVar6 << 0x1b | uVar6 >> 5);
    seed = uVar5 + iVar7;
    uVar5 = iVar7 + uVar4;
    iVar2 = iVar2 + -1;
    uVar6 = uVar1;
    uVar3 = uVar4;
  } while (iVar2 != 0);
  this->a = uVar4;
  this->b = uVar1;
  this->c = seed;
  this->d = uVar5;
  return;
}

Assistant:

void ranctx::seed(uint32 seed) {
  a = 0xf1ea5eed, b = c = d = seed;
  for (uint32 i = 0; i < 20; ++i)
    next();
}